

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

void If_CluCountOnesInCofs(word *pTruth,int nVars,int *pStore)

{
  int *piVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  
  uVar6 = 1 << ((char)nVars - 6U & 0x1f);
  uVar10 = 1;
  if (6 < nVars) {
    uVar10 = uVar6;
  }
  iVar9 = 0;
  memset(pStore,0,(long)nVars << 3);
  if (0 < (int)uVar10) {
    uVar5 = 6;
    if (nVars < 6) {
      uVar5 = (ulong)(uint)nVars;
    }
    uVar4 = 0;
    do {
      if (0 < nVars) {
        uVar2 = pTruth[uVar4];
        lVar3 = 0;
        do {
          uVar7 = *(ulong *)((long)Truth6 + lVar3) & uVar2;
          uVar7 = (uVar7 >> 1 & 0x5555555555555555) + (uVar7 & 0x5555555555555555);
          uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          uVar7 = (uVar7 >> 4 & 0x707070707070707) + (uVar7 & 0x707070707070707);
          uVar7 = (uVar7 >> 8 & 0xf000f000f000f) + (uVar7 & 0xf000f000f000f);
          lVar8 = (uVar7 >> 0x10 & 0x1f0000001f) + (uVar7 & 0x1f0000001f);
          piVar1 = (int *)((long)pStore + lVar3 + 4);
          *piVar1 = *piVar1 + (int)((ulong)lVar8 >> 0x20) + (int)lVar8;
          lVar3 = lVar3 + 8;
        } while (uVar5 * 8 != lVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar10);
    if (6 < nVars && 0 < (int)uVar10) {
      uVar5 = 0;
      do {
        lVar3 = 0;
        do {
          if (((uint)uVar5 >> ((uint)lVar3 & 0x1f) & 1) != 0) {
            uVar4 = (pTruth[uVar5] >> 1 & 0x5555555555555555) + (pTruth[uVar5] & 0x5555555555555555)
            ;
            uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
            uVar4 = (uVar4 >> 4 & 0x707070707070707) + (uVar4 & 0x707070707070707);
            uVar4 = (uVar4 >> 8 & 0xf000f000f000f) + (uVar4 & 0xf000f000f000f);
            lVar8 = (uVar4 >> 0x10 & 0x1f0000001f) + (uVar4 & 0x1f0000001f);
            pStore[lVar3 * 2 + 0xd] =
                 pStore[lVar3 * 2 + 0xd] + (int)((ulong)lVar8 >> 0x20) + (int)lVar8;
          }
          lVar3 = lVar3 + 1;
        } while ((ulong)(uint)nVars - 6 != lVar3);
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar6);
    }
    if ((int)uVar10 < 1) {
      iVar9 = 0;
    }
    else {
      uVar5 = 0;
      iVar9 = 0;
      do {
        uVar4 = (pTruth[uVar5] >> 1 & 0x5555555555555555) + (pTruth[uVar5] & 0x5555555555555555);
        uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
        uVar4 = (uVar4 >> 4 & 0x707070707070707) + (uVar4 & 0x707070707070707);
        uVar4 = (uVar4 >> 8 & 0xf000f000f000f) + (uVar4 & 0xf000f000f000f);
        lVar3 = (uVar4 >> 0x10 & 0x1f0000001f) + (uVar4 & 0x1f0000001f);
        iVar9 = (int)lVar3 + iVar9 + (int)((ulong)lVar3 >> 0x20);
        uVar5 = uVar5 + 1;
      } while (uVar10 != uVar5);
    }
  }
  if (0 < nVars) {
    uVar5 = 0;
    do {
      pStore[uVar5 * 2] = iVar9 - pStore[uVar5 * 2 + 1];
      uVar5 = uVar5 + 1;
    } while ((uint)nVars != uVar5);
  }
  return;
}

Assistant:

void If_CluCountOnesInCofs( word * pTruth, int nVars, int * pStore )
{
    int nWords = If_CluWordNum( nVars );
    int i, k, nOnes = 0, Limit = Abc_MinInt( nVars, 6 );
    memset( pStore, 0, sizeof(int) * 2 * nVars );
    // compute positive cofactors
    for ( k = 0; k < nWords; k++ )
        for ( i = 0; i < Limit; i++ )
            pStore[2*i+1] += If_CluCountOnes( pTruth[k] & Truth6[i] );
    if ( nVars > 6 )
    for ( k = 0; k < nWords; k++ )
        for ( i = 6; i < nVars; i++ )
            if ( k & (1 << (i-6)) )
                pStore[2*i+1] += If_CluCountOnes( pTruth[k] );
    // compute negative cofactors
    for ( k = 0; k < nWords; k++ )
        nOnes += If_CluCountOnes( pTruth[k] );
    for ( i = 0; i < nVars; i++ )
        pStore[2*i] = nOnes - pStore[2*i+1];
}